

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::buildValidSubstitutionListB
          (TraverseSchema *this,DOMElement *elem,SchemaElementDecl *elemDecl,
          SchemaElementDecl *subsElemDecl)

{
  uint key2;
  SchemaElementDecl *subsElemDecl_00;
  QName *pQVar1;
  XMLCh *key1;
  GrammarResolver *this_00;
  ulong uVar2;
  BaseRefVectorOf<xercesc_4_0::SchemaInfo> *this_01;
  XMLSize_t XVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar7;
  undefined4 extraout_var;
  Grammar *pGVar8;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *toCopy;
  SchemaInfo *pSVar9;
  ulong uVar10;
  XMLSize_t XVar11;
  
  subsElemDecl_00 = subsElemDecl->fSubstitutionGroupElem;
  do {
    if (subsElemDecl_00 == (SchemaElementDecl *)0x0) {
      return;
    }
    pQVar1 = (subsElemDecl_00->super_XMLElementDecl).fElementName;
    key2 = pQVar1->fURIId;
    key1 = pQVar1->fLocalPart;
    pVVar7 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
             ::get(this->fValidSubstitutionGroups,key1,key2);
    if (pVVar7 == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
      if (this->fTargetNSURI == key2) {
        return;
      }
      this_00 = this->fGrammarResolver;
      iVar6 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[10])
                        (this->fURIStringPool,(ulong)key2);
      pGVar8 = GrammarResolver::getGrammar(this_00,(XMLCh *)CONCAT44(extraout_var,iVar6));
      if (pGVar8 == (Grammar *)0x0) {
        return;
      }
      toCopy = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
               ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                      *)pGVar8[10].super_XSerializable._vptr_XSerializable,key1,key2);
      if (toCopy == (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
        return;
      }
      pVVar7 = (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)
               XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
      ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ValueVectorOf(pVVar7,toCopy);
      RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
      ::put(this->fValidSubstitutionGroups,key1,key2,pVVar7);
    }
    uVar2 = pVVar7->fCurCount;
    if (uVar2 != 0) {
      if (*pVVar7->fElemList == elemDecl) {
        return;
      }
      uVar4 = 1;
      do {
        uVar10 = uVar4;
        if (uVar2 == uVar10) break;
        uVar4 = uVar10 + 1;
      } while (pVVar7->fElemList[uVar10] != elemDecl);
      if (uVar10 < uVar2) {
        return;
      }
    }
    bVar5 = isSubstitutionGroupValid
                      (this,elem,subsElemDecl_00,elemDecl->fComplexTypeInfo,
                       elemDecl->fDatatypeValidator,(XMLCh *)0x0,false);
    if (!bVar5) {
      return;
    }
    ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar7,1);
    XVar11 = pVVar7->fCurCount;
    pVVar7->fCurCount = XVar11 + 1;
    pVVar7->fElemList[XVar11] = elemDecl;
    this_01 = &this->fSchemaInfo->fImportingInfoList->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>
    ;
    if (this_01->fCurCount != 0) {
      XVar11 = 0;
      do {
        pSVar9 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt(this_01,XVar11);
        pGVar8 = GrammarResolver::getGrammar(this->fGrammarResolver,pSVar9->fTargetNSURIString);
        pVVar7 = RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                 ::get((RefHash2KeysTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                        *)pGVar8[10].super_XSerializable._vptr_XSerializable,key1,key2);
        if (pVVar7 != (ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *)0x0) {
          uVar2 = pVVar7->fCurCount;
          if (uVar2 == 0) {
LAB_003334c3:
            ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::ensureExtraCapacity(pVVar7,1);
            XVar3 = pVVar7->fCurCount;
            pVVar7->fCurCount = XVar3 + 1;
            pVVar7->fElemList[XVar3] = elemDecl;
          }
          else if (*pVVar7->fElemList != elemDecl) {
            uVar4 = 1;
            do {
              uVar10 = uVar4;
              if (uVar2 == uVar10) break;
              uVar4 = uVar10 + 1;
            } while (pVVar7->fElemList[uVar10] != elemDecl);
            if (uVar2 <= uVar10) goto LAB_003334c3;
          }
        }
        XVar11 = XVar11 + 1;
      } while (XVar11 < this_01->fCurCount);
    }
    subsElemDecl_00 = subsElemDecl_00->fSubstitutionGroupElem;
  } while( true );
}

Assistant:

void
TraverseSchema::buildValidSubstitutionListB(const DOMElement* const elem,
                                            SchemaElementDecl* const elemDecl,
                                            SchemaElementDecl* const subsElemDecl) {

    SchemaElementDecl* chainElemDecl = subsElemDecl->getSubstitutionGroupElem();

    while (chainElemDecl) {

        int chainElemURI = chainElemDecl->getURI();
        XMLCh* chainElemName = chainElemDecl->getBaseName();
        ValueVectorOf<SchemaElementDecl*>* validSubsElements =
            fValidSubstitutionGroups->get(chainElemName, chainElemURI);

        if (!validSubsElements) {

            if (fTargetNSURI == chainElemURI) {
                break; // an error must have occured
            }

            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(fURIStringPool->getValueForId(chainElemURI));

            if (!aGrammar)
                break;

            validSubsElements = aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (!validSubsElements) {
                break;
            }

            validSubsElements = new (fGrammarPoolMemoryManager) ValueVectorOf<SchemaElementDecl*>(*validSubsElements);
            fValidSubstitutionGroups->put((void*) chainElemName, chainElemURI, validSubsElements);
        }

        if (validSubsElements->containsElement(elemDecl) ||
            !isSubstitutionGroupValid(elem, chainElemDecl, elemDecl->getComplexTypeInfo(),
                                      elemDecl->getDatatypeValidator(), 0, false)) {
            break;
        }

        validSubsElements->addElement(elemDecl);

        // update related subs. info in case of circular import
        BaseRefVectorEnumerator<SchemaInfo> importingEnum = fSchemaInfo->getImportingListEnumerator();

        while (importingEnum.hasMoreElements()) {

            const SchemaInfo& curRef = importingEnum.nextElement();
            SchemaGrammar* aGrammar = (SchemaGrammar*) fGrammarResolver->getGrammar(curRef.getTargetNSURIString());
            ValueVectorOf<SchemaElementDecl*>* subsElemList =
                aGrammar->getValidSubstitutionGroups()->get(chainElemName, chainElemURI);

            if (subsElemList && !subsElemList->containsElement(elemDecl)) {
                subsElemList->addElement(elemDecl);
            }
        }

        chainElemDecl = chainElemDecl->getSubstitutionGroupElem();
    }
}